

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

QNetworkRequest __thiscall
QNetworkRequestFactoryPrivate::newRequest(QNetworkRequestFactoryPrivate *this,QUrl *url)

{
  Entry *pEVar1;
  piter pVar2;
  bool bVar3;
  QUrl *in_RDX;
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  piter pVar6;
  QHttpHeaders h;
  wrapped_t<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_QByteArray> local_78;
  QStringBuilder<const_char_(&)[8],_const_QByteArray_&> local_58;
  QAnyStringView local_48;
  QHttpHeaders local_38;
  char local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)this);
  QNetworkRequest::setUrl((QNetworkRequest *)this,in_RDX);
  bVar3 = QSslConfiguration::isNull((QSslConfiguration *)(url + 1));
  if (!bVar3) {
    QNetworkRequest::setSslConfiguration((QNetworkRequest *)this,(QSslConfiguration *)(url + 1));
  }
  local_38.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHttpHeaders::QHttpHeaders(&local_38,(QHttpHeaders *)(url + 3));
  builtin_strncpy(local_30,"Bearer ",8);
  if (url[6].d != (QUrlPrivate *)0x0) {
    local_58.b = (QByteArray *)(url + 4);
    local_58.a = &local_30;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char *)0x0;
    local_78.d.size = 0;
    QAnyStringView::QAnyStringView<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_true>
              (&local_48,&local_58,&local_78);
    QHttpHeaders::replaceOrAppend(&local_38,Authorization,local_48);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QNetworkRequest::setHeaders((QNetworkRequest *)this,&local_38);
  QNetworkRequest::setTransferTimeout((QNetworkRequest *)this,(milliseconds)url[0xf].d);
  QNetworkRequest::setPriority((QNetworkRequest *)this,*(Priority *)&url[0xe].d);
  local_78.d.d = (Data *)(url + 0x10);
  pVar6 = (piter)QtPrivate::QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&>::
                 begin((QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&> *)
                       &local_78);
  if (pVar6.d != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0 ||
      pVar6.bucket != 0) {
    do {
      uVar5 = pVar6.bucket;
      pDVar4 = pVar6.d;
      pEVar1 = pDVar4->spans[uVar5 >> 7].entries +
               pDVar4->spans[uVar5 >> 7].offsets[(uint)pVar6.bucket & 0x7f];
      QNetworkRequest::setAttribute
                ((QNetworkRequest *)this,*(Attribute *)(pEVar1->storage).data,
                 (QVariant *)((pEVar1->storage).data + 8));
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          uVar5 = 0;
          pDVar4 = (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      pVar2.bucket = uVar5;
      pVar2.d = pDVar4;
      pVar6.bucket = uVar5;
      pVar6.d = pDVar4;
    } while ((pDVar4 != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0) ||
            (pVar6 = pVar2, uVar5 != 0));
  }
  QHttpHeaders::~QHttpHeaders(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkRequestPrivate>)
         (QSharedDataPointer<QNetworkRequestPrivate>)this;
}

Assistant:

QNetworkRequest QNetworkRequestFactoryPrivate::newRequest(const QUrl &url) const
{
    QNetworkRequest request;
    request.setUrl(url);
#if QT_CONFIG(ssl)
    if (!sslConfig.isNull())
        request.setSslConfiguration(sslConfig);
#endif
    auto h = headers;
    constexpr char Bearer[] = "Bearer ";
    if (!bearerToken.isEmpty())
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Authorization, Bearer + bearerToken);
    request.setHeaders(std::move(h));

    request.setTransferTimeout(transferTimeout);
    request.setPriority(priority);

    for (const auto &[attribute, value] : attributes.asKeyValueRange())
        request.setAttribute(attribute, value);

    return request;
}